

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::writePivots(HModel *this,char *suffix)

{
  pointer piVar1;
  pointer piVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream output;
  undefined8 auStack_220 [63];
  
  std::operator+(&local_248,"z-",&this->modelName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                 &local_248,"-");
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,suffix
                );
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&local_248);
  std::ofstream::ofstream(&output,filename._M_dataplus._M_p,_S_out);
  piVar1 = (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  poVar3 = std::operator<<((ostream *)&output,(string *)&this->modelName);
  poVar3 = std::operator<<(poVar3," ");
  uVar6 = (ulong)((long)piVar1 - (long)piVar2) >> 2;
  iVar5 = (int)uVar6;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<double>(this->totalTime);
  std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)((long)auStack_220 + *(long *)(_output + -0x18)) = 0xc;
  uVar4 = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar5 < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&output,
                        (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,"\t");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&output,
                        (this->historyColumnOut).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void HModel::writePivots(const char *suffix) {
    string filename = "z-" + modelName + "-" + suffix;
    ofstream output(filename.c_str());
    int count = historyColumnIn.size();
    output << modelName << " " << count << "\t" << totalTime << endl;
    output << setprecision(12);
    for (int i = 0; i < count; i++) {
        output << historyColumnIn[i] << "\t";
        output << historyColumnOut[i] << "\t";
        output << historyAlpha[i] << endl;
    }
    output.close();
}